

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O3

bool hashSearch<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *vals,string *hash_str,string *map_name,string *default_value,
               uint8_t expansion,uint8_t reduction,bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  uint uVar11;
  uint32_t uVar12;
  int iVar13;
  size_t n;
  long *plVar14;
  size_t sVar15;
  long *plVar16;
  uint8_t active_coeffs;
  byte bVar17;
  byte bVar18;
  pointer pbVar19;
  uint uVar20;
  size_type sVar21;
  string *psVar22;
  ulong uVar23;
  size_type sVar24;
  long lVar25;
  uint uVar26;
  string upper_name;
  vector<int,_std::allocator<int>_> mapping;
  array<unsigned_int,_6UL> best_c;
  uint local_1f0;
  string local_1d0;
  string *local_1b0;
  string *local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1a0;
  pointer local_198;
  _Bit_type *local_190;
  uint local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  vector<int,_std::allocator<int>_> local_130;
  size_type local_118;
  string *local_110;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<bool,_std::allocator<bool>_> local_58;
  
  pbVar19 = (keys->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar25 = (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19;
  uVar23 = lVar25 >> 5;
  local_1b0 = hash_str;
  local_1a8 = map_name;
  local_1a0 = keys;
  local_158 = vals;
  local_110 = default_value;
  if (uVar23 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x84,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  bVar10 = hasDuplicates<std::__cxx11::string>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pbVar19);
  if (bVar10) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x85,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  if ((long)(local_158->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_158->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != lVar25) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x86,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  pbVar19 = (pointer)0x0;
  n = getModulusBitmask((uVar23 * expansion) / (ulong)reduction);
  local_118 = n + 1;
  local_1d0._M_dataplus._M_p = local_1d0._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,local_118,(bool *)&local_1d0,(allocator_type *)&local_150);
  uVar5 = c_max._M_elems[2];
  uVar26 = c_max._M_elems[1];
  c._M_elems[0] = c_min._M_elems[0];
  local_180 = c_max._M_elems[0];
  if (c_min._M_elems[0] <= c_max._M_elems[0]) {
    local_184 = c_min._M_elems[1];
    local_178 = c_min._M_elems[2];
    bVar18 = 7;
    uVar11 = c_min._M_elems[0];
    do {
      uVar6 = c_max._M_elems[3];
      c._M_elems[1] = local_184;
      local_1f0 = (uint)n;
      local_17c = uVar11;
      if (local_184 <= uVar26) {
        local_170 = c_min._M_elems[3];
        uVar11 = local_184;
        do {
          uVar7 = c_max._M_elems[4];
          c._M_elems[2] = local_178;
          local_174 = uVar11;
          if (local_178 <= uVar5) {
            local_168 = c_min._M_elems[4];
            uVar11 = local_178;
            do {
              uVar8 = c_max._M_elems[5];
              c._M_elems[3] = local_170;
              local_16c = uVar11;
              if (local_170 <= uVar6) {
                local_160 = c_min._M_elems[5];
                uVar11 = local_170;
                do {
                  c._M_elems[4] = local_168;
                  local_164 = uVar11;
                  uVar11 = local_168;
                  while (uVar11 <= uVar7) {
                    c._M_elems[5] = local_160;
                    local_15c = uVar11;
                    uVar11 = local_160;
                    while (uVar11 <= uVar8) {
                      lVar25 = 5;
                      bVar17 = 0;
                      do {
                        bVar17 = (bVar17 + 1) - (c._M_elems[lVar25] == 0);
                        bVar10 = lVar25 != 0;
                        lVar25 = lVar25 + -1;
                      } while (bVar10);
                      if (bVar17 < bVar18) {
                        pbVar19 = (local_1a0->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        pbVar2 = (local_1a0->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                        sVar15 = n;
                        if (n != 0xffffffffffffffff) {
                          do {
                            uVar23 = sVar15 + 0x3f;
                            if (-1 < (long)sVar15) {
                              uVar23 = sVar15;
                            }
                            bVar4 = (byte)sVar15 & 0x3f;
                            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [((long)uVar23 >> 6) +
                             ((ulong)((sVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [((long)uVar23 >> 6) +
                                  ((ulong)((sVar15 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                                 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                            bVar10 = sVar15 != 0;
                            sVar15 = sVar15 - 1;
                          } while (bVar10);
                        }
                        lVar25 = (long)pbVar2 - (long)pbVar19;
                        if (lVar25 != 0) {
                          lVar25 = lVar25 >> 5;
                          local_198 = pbVar19;
                          local_190 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p;
                          do {
                            lVar25 = lVar25 + -1;
                            sVar24 = local_198[lVar25]._M_string_length;
                            if (sVar24 == 0) {
                              uVar20 = 0;
                            }
                            else {
                              pcVar3 = local_198[lVar25]._M_dataplus._M_p;
                              sVar21 = 0;
                              uVar20 = 0;
                              do {
                                uVar12 = hash((int)pcVar3[sVar21]);
                                uVar20 = uVar20 ^ uVar12;
                                sVar21 = sVar21 + 1;
                              } while (sVar24 != sVar21);
                            }
                            uVar20 = uVar20 & local_1f0;
                            if ((local_190[uVar20 >> 6] >> ((ulong)uVar20 & 0x3f) & 1) != 0)
                            goto LAB_0010db7c;
                            local_190[uVar20 >> 6] =
                                 1L << ((byte)uVar20 & 0x3f) | local_190[uVar20 >> 6];
                          } while (lVar25 != 0);
                        }
                        local_78[0] = c._M_elems[4];
                        local_78[1] = c._M_elems[5];
                        local_88[0] = c._M_elems[0];
                        local_88[1] = c._M_elems[1];
                        auStack_80[0] = c._M_elems[2];
                        auStack_80[1] = c._M_elems[3];
                        bVar18 = bVar17;
                      }
LAB_0010db7c:
                      uVar11 = uVar11 + 1;
                      c._M_elems[5] = uVar11;
                    }
                    uVar11 = local_15c + 1;
                    c._M_elems[4] = uVar11;
                  }
                  uVar11 = local_164 + 1;
                  c._M_elems[3] = uVar11;
                } while (uVar11 <= uVar6);
              }
              uVar11 = local_16c + 1;
              c._M_elems[2] = uVar11;
            } while (uVar11 <= uVar5);
          }
          uVar11 = local_174 + 1;
          c._M_elems[1] = uVar11;
        } while (uVar11 <= uVar26);
      }
      uVar11 = local_17c + 1;
      c._M_elems[0] = uVar11;
    } while (uVar11 <= local_180);
    if (bVar18 == 7) {
      pbVar19 = (pointer)0x0;
    }
    else {
      c._M_elems[4] = local_78[0];
      c._M_elems[5] = local_78[1];
      c._M_elems[0] = local_88[0];
      c._M_elems[1] = local_88[1];
      c._M_elems[2] = auStack_80[0];
      c._M_elems[3] = auStack_80[1];
      local_1d0._M_dataplus._M_p._0_4_ = 0xffffffff;
      local_198 = (pointer)(ulong)CONCAT31((int3)(uVar11 >> 8),bVar18 != 7);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_130,local_118,(value_type_conflict4 *)&local_1d0,
                 (allocator_type *)&local_150);
      pbVar19 = (local_1a0->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar25 = (long)(local_1a0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19;
      if (lVar25 != 0) {
        lVar25 = lVar25 >> 5;
        local_190 = (_Bit_type *)
                    local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        do {
          lVar25 = lVar25 + -1;
          sVar24 = pbVar19[lVar25]._M_string_length;
          if (sVar24 == 0) {
            uVar26 = 0;
          }
          else {
            pcVar3 = pbVar19[lVar25]._M_dataplus._M_p;
            sVar21 = 0;
            uVar26 = 0;
            do {
              uVar12 = hash((int)pcVar3[sVar21]);
              uVar26 = uVar26 ^ uVar12;
              sVar21 = sVar21 + 1;
            } while (sVar24 != sVar21);
          }
          *(int *)((long)local_190 + (ulong)(uVar26 & local_1f0) * 4) = (int)lVar25;
        } while (lVar25 != 0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_70,local_158);
      pcVar3 = (local_1a8->_M_dataplus)._M_p;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar3,pcVar3 + local_1a8->_M_string_length);
      getCommonCodeGen<std::__cxx11::string>
                (&local_1d0,local_1a0,&local_70,&local_130,n,&local_e8,nonKeyLookups);
      std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_1d0);
      paVar1 = &local_1d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
      psVar22 = (string *)(local_1a8->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,psVar22,
                 (pointer)((long)&(psVar22->_M_dataplus)._M_p + local_1a8->_M_string_length));
      local_a8.field_2._M_allocated_capacity._0_7_ = 0x74733a3a647473;
      local_a8.field_2._7_4_ = 0x676e6972;
      local_a8._M_string_length = 0xb;
      local_a8.field_2._M_local_buf[0xb] = '\0';
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      hashStr(&local_1d0,psVar22,n,local_110,&local_108,&local_a8,nonKeyLookups);
      std::__cxx11::string::_M_append((char *)local_1b0,(ulong)local_1d0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (local_1a8->_M_dataplus)._M_p;
      local_1d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar3,pcVar3 + local_1a8->_M_string_length);
      _Var9._M_p = local_1d0._M_dataplus._M_p;
      if (local_1d0._M_string_length != 0) {
        sVar24 = 0;
        do {
          iVar13 = toupper((int)_Var9._M_p[sVar24]);
          _Var9._M_p[sVar24] = (char)iVar13;
          sVar24 = sVar24 + 1;
        } while (local_1d0._M_string_length != sVar24);
      }
      std::operator+(&local_c8,"#endif // POIFECT_",&local_1d0);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_c8);
      plVar16 = plVar14 + 2;
      if ((long *)*plVar14 == plVar16) {
        local_140 = *plVar16;
        lStack_138 = plVar14[3];
        local_150 = &local_140;
      }
      else {
        local_140 = *plVar16;
        local_150 = (long *)*plVar14;
      }
      local_148 = plVar14[1];
      *plVar14 = (long)plVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_1b0,(ulong)local_150);
      if (local_150 != &local_140) {
        operator_delete(local_150,local_140 + 1);
      }
      pbVar19 = local_198;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((_Bit_type *)
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_Bit_type *)0x0) {
        operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (bool)(char)pbVar19;
}

Assistant:

bool hashSearch(const std::vector<KeyType>& keys,
                const std::vector<std::string>& vals,
                std::string& hash_str,
                std::string map_name = "PoifectMap",
                std::string default_value = "",
                uint8_t expansion = 1,
                uint8_t reduction = 1,
                bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    size_t n = getModulusBitmask(keys.size() * expansion / reduction);
    std::vector<bool> hash_table(n+1, false);
    uint8_t best_num_c = c.size()+1;
    std::array<uint32_t, c.size()> best_c;

    #define ITERATE_INDEX(i) for(c[i] = c_min[i]; c[i] <= c_max[i]; c[i]++)

    ITERATE_INDEX(0)
    ITERATE_INDEX(1)
    ITERATE_INDEX(2)
    ITERATE_INDEX(3)
    ITERATE_INDEX(4)
    ITERATE_INDEX(5)
    {
        const uint8_t num_c = checkNonzeroCoeffs();
        if(num_c < best_num_c && !hasCollisions(keys, n, hash_table)){
            best_num_c = num_c;
            best_c = c;
        }
    }

    if(best_num_c == c.size()+1) return false;

    c = best_c;
    std::vector<int> mapping(n+1, -1);
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        mapping[hash(keys[i])&n] = i;

    hash_str = getCommonCodeGen(keys, vals, mapping, n, map_name, nonKeyLookups);

    hash_str += hashStr(keys[0], n, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";

    return true;
}